

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O3

unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_> __thiscall
wabt::MakeUnique<wabt::GlobalModuleField,wabt::Location>(wabt *this,Location *args)

{
  size_type sVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  string_view local_28;
  
  puVar4 = (undefined8 *)operator_new(0x80);
  puVar4[1] = 0;
  puVar4[2] = 0;
  sVar1 = (args->filename).size_;
  sVar2 = (args->field_1).field_1.offset;
  uVar3 = *(undefined8 *)((long)&args->field_1 + 8);
  puVar4[3] = (args->filename).data_;
  puVar4[4] = sVar1;
  puVar4[5] = sVar2;
  puVar4[6] = uVar3;
  *(undefined4 *)(puVar4 + 7) = 1;
  *puVar4 = &PTR__GlobalModuleField_00180d60;
  local_28.data_ = (char *)0x0;
  local_28.size_ = 0;
  string_view::to_string_abi_cxx11_((string *)(puVar4 + 8),&local_28);
  *(undefined4 *)(puVar4 + 0xc) = 0xffffffc0;
  *(undefined1 *)((long)puVar4 + 100) = 0;
  puVar4[0xd] = 0;
  puVar4[0xe] = 0;
  puVar4[0xf] = 0;
  *(undefined8 **)this = puVar4;
  return (__uniq_ptr_data<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}